

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::bi_windup(IZDeflate *this)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  
  if (this->bi_valid < 9) {
    if (0 < this->bi_valid) {
      uVar2 = this->out_offset;
      if (this->out_size <= uVar2) {
        flush_outbuf(this->out_buf,&this->out_offset);
        uVar2 = this->out_offset;
      }
      this->out_offset = uVar2 + 1;
      this->out_buf[uVar2] = (char)this->bi_buf;
    }
  }
  else {
    uVar2 = this->out_offset;
    if (this->out_size - 1 <= uVar2) {
      flush_outbuf(this->out_buf,&this->out_offset);
      uVar2 = this->out_offset;
    }
    this->out_offset = uVar2 + 1;
    this->out_buf[uVar2] = (char)this->bi_buf;
    cVar1 = *(char *)((long)&this->bi_buf + 1);
    uVar2 = this->out_offset;
    this->out_offset = uVar2 + 1;
    this->out_buf[uVar2] = cVar1;
    this->bi_valid = this->bi_valid + -8;
  }
  if (this->flush_flg != 0) {
    flush_outbuf(this->out_buf,&this->out_offset);
  }
  iVar3 = 8;
  if (this->bi_valid != 0) {
    iVar3 = this->bi_valid;
  }
  this->last_bits = iVar3;
  this->bi_buf = 0;
  this->bi_valid = 0;
  return;
}

Assistant:

void IZDeflate::bi_windup()
{
    if (bi_valid > 8) {
        PUTSHORT(bi_buf);
        bi_valid -= 8;
    } else if (bi_valid > 0) {
        PUTBYTE(bi_buf);
    }
    if (flush_flg) {
        flush_outbuf(out_buf, &out_offset);
    }

    last_bits = bi_valid;
    if(last_bits == 0)
      last_bits = 8;

    bi_buf = 0;
    bi_valid = 0;
#ifdef DEBUG
    bits_sent = (bits_sent+7) & ~7;
#endif
}